

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O2

Move<vk::Handle<(vk::HandleType)18>_> * __thiscall
vkt::tessellation::GraphicsPipelineBuilder::build
          (Move<vk::Handle<(vk::HandleType)18>_> *__return_storage_ptr__,
          GraphicsPipelineBuilder *this,DeviceInterface *vk,VkDevice device,
          VkPipelineLayout pipelineLayout,VkRenderPass renderPass)

{
  bool bVar1;
  VkPrimitiveTopology VVar2;
  long lVar3;
  ulong uVar4;
  VkPipelineDepthStencilStateCreateInfo *pVVar5;
  VkViewport *pVVar6;
  uint uVar7;
  bool bVar8;
  vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_> dynamicStates;
  VkPipelineTessellationStateCreateInfo pipelineTessellationStateInfo;
  VkPipelineVertexInputStateCreateInfo vertexInputStateInfo;
  VkPipelineInputAssemblyStateCreateInfo pipelineInputAssemblyStateInfo;
  VkPipelineViewportStateCreateInfo pipelineViewportStateInfo;
  VkPipelineMultisampleStateCreateInfo pipelineMultisampleStateInfo;
  VkPipelineRasterizationStateCreateInfo local_208;
  undefined1 local_1c8 [40];
  undefined1 local_1a0 [24];
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  VkRect2D scissor;
  VkViewport res;
  VkPipelineDynamicStateCreateInfo pipelineDynamicStateInfo;
  uint local_e0 [8];
  VkGraphicsPipelineCreateInfo graphicsPipelineInfo;
  
  vertexInputStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  vertexInputStateInfo.pNext = (void *)0x0;
  vertexInputStateInfo.flags = 0;
  vertexInputStateInfo.pVertexBindingDescriptions =
       (this->m_vertexInputBindings).
       super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pVVar6 = (VkViewport *)0x0;
  lVar3 = (long)(this->m_vertexInputBindings).
                super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)vertexInputStateInfo.pVertexBindingDescriptions;
  if (lVar3 == 0) {
    vertexInputStateInfo.pVertexBindingDescriptions = (VkVertexInputBindingDescription *)pVVar6;
  }
  vertexInputStateInfo.vertexBindingDescriptionCount = (deUint32)(lVar3 / 0xc);
  vertexInputStateInfo.pVertexAttributeDescriptions =
       (this->m_vertexInputAttributes).
       super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
       ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (long)(this->m_vertexInputAttributes).
                super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)vertexInputStateInfo.pVertexAttributeDescriptions;
  if (uVar4 == 0) {
    vertexInputStateInfo.pVertexAttributeDescriptions = (VkVertexInputAttributeDescription *)pVVar6;
  }
  vertexInputStateInfo.vertexAttributeDescriptionCount = (deUint32)(uVar4 >> 4);
  if ((this->m_shaderStageFlags & 2) == 0) {
    VVar2 = this->m_primitiveTopology;
  }
  else {
    VVar2 = VK_PRIMITIVE_TOPOLOGY_PATCH_LIST;
  }
  pipelineInputAssemblyStateInfo.pNext = (void *)0x0;
  pipelineInputAssemblyStateInfo.primitiveRestartEnable = 0;
  pipelineInputAssemblyStateInfo._28_4_ = 0;
  pipelineInputAssemblyStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO
  ;
  pipelineInputAssemblyStateInfo._4_4_ = 0;
  pipelineInputAssemblyStateInfo._16_8_ = (ulong)VVar2 << 0x20;
  pipelineTessellationStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO;
  pipelineTessellationStateInfo.pNext = (void *)0x0;
  pipelineTessellationStateInfo.flags = 0;
  pipelineTessellationStateInfo.patchControlPoints = this->m_patchControlPoints;
  res.x = 0.0;
  res.y = 0.0;
  uVar4 = *(ulong *)(this->m_renderSize).m_data;
  scissor.offset.x = 0;
  scissor.offset.y = 0;
  uVar7 = (uint)(uVar4 >> 0x20);
  bVar8 = (int)uVar4 < 1;
  res.width = (float)(int)uVar4;
  res.height = (float)(int)uVar7;
  res.minDepth = 0.0;
  res.maxDepth = 1.0;
  bVar1 = (int)uVar7 < 1;
  pipelineViewportStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  pipelineViewportStateInfo.pNext = (void *)0x0;
  scissor.extent = (VkExtent2D)(((ulong)uVar7 << 0x20) + (uVar4 & 0xffffffff));
  pipelineViewportStateInfo.flags = 0;
  pipelineViewportStateInfo.viewportCount = 1;
  pipelineViewportStateInfo.pViewports = &res;
  if (bVar8 || bVar1) {
    pipelineViewportStateInfo.pViewports = pVVar6;
  }
  pipelineViewportStateInfo.scissorCount = 1;
  pipelineViewportStateInfo.pScissors = (VkRect2D *)&scissor;
  if (bVar8 || bVar1) {
    pipelineViewportStateInfo.pScissors = (VkRect2D *)pVVar6;
  }
  uVar7 = this->m_shaderStageFlags & 0x10;
  local_208.sType = VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO;
  local_208.rasterizerDiscardEnable = uVar7 >> 4 ^ VK_STENCIL_OP_ZERO;
  local_208.pNext = (void *)0x0;
  local_208.flags = 0;
  local_208.depthClampEnable = 0;
  local_208.polygonMode = VK_POLYGON_MODE_FILL;
  local_208.cullMode = this->m_cullModeFlags;
  local_208.frontFace = this->m_frontFace;
  local_208.depthBiasEnable = 0;
  local_208.depthBiasConstantFactor = 0.0;
  local_208.depthBiasClamp = 0.0;
  local_208.depthBiasSlopeFactor = 0.0;
  local_208.lineWidth = 1.0;
  pipelineMultisampleStateInfo.pNext = (void *)0x0;
  pipelineMultisampleStateInfo.sampleShadingEnable = 0;
  pipelineMultisampleStateInfo.minSampleShading = 0.0;
  pipelineMultisampleStateInfo.pSampleMask = (VkSampleMask *)0x0;
  pipelineMultisampleStateInfo.alphaToCoverageEnable = 0;
  pipelineMultisampleStateInfo.alphaToOneEnable = 0;
  pipelineMultisampleStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  pipelineMultisampleStateInfo._4_4_ = 0;
  pipelineMultisampleStateInfo.flags = 0;
  pipelineMultisampleStateInfo.rasterizationSamples = VK_SAMPLE_COUNT_1_BIT;
  local_1a0._16_4_ = 0x19;
  local_188._0_4_ = 0;
  local_188._4_4_ = VK_STENCIL_OP_KEEP;
  uStack_180._0_4_ = VK_STENCIL_OP_KEEP;
  uStack_180._4_4_ = VK_STENCIL_OP_KEEP;
  local_178._0_4_ = VK_COMPARE_OP_NEVER;
  local_178._4_4_ = 1;
  local_170._0_4_ = 0;
  local_170._4_4_ = 0;
  uStack_168._0_4_ = 0.0;
  uStack_168._4_4_ = 0.0;
  local_160 = 0;
  uStack_158 = 0;
  local_150 = 0;
  uStack_148 = 0;
  local_140 = 0;
  uStack_138 = 0;
  local_130 = 0x3f80000000000000;
  local_1c8._32_8_ = local_e0;
  local_e0[0] = (uint)this->m_blendEnable;
  local_e0[1] = 6;
  local_e0[2] = VK_STENCIL_OP_ZERO;
  local_e0[3] = VK_STENCIL_OP_KEEP;
  local_e0[4] = VK_STENCIL_OP_INCREMENT_AND_WRAP;
  local_e0[5] = VK_COMPARE_OP_LESS;
  local_e0[6] = 0;
  local_e0[7] = 0xf;
  local_1c8._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO;
  local_1c8._8_8_ = (void *)0x0;
  local_1c8._16_4_ = 0;
  local_1c8._20_4_ = 0;
  local_1c8._24_4_ = 3;
  local_1c8._28_4_ = VK_COMPARE_OP_LESS;
  dynamicStates.super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a0._0_4_ = VK_STENCIL_OP_KEEP;
  local_1a0._4_4_ = VK_STENCIL_OP_KEEP;
  local_1a0._8_4_ = VK_STENCIL_OP_KEEP;
  local_1a0._12_4_ = VK_COMPARE_OP_NEVER;
  dynamicStates.super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dynamicStates.super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar8 || bVar1) {
    graphicsPipelineInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::
    emplace_back<vk::VkDynamicState>(&dynamicStates,&graphicsPipelineInfo.sType);
    graphicsPipelineInfo.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
    std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::
    emplace_back<vk::VkDynamicState>(&dynamicStates,&graphicsPipelineInfo.sType);
  }
  pipelineDynamicStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_DYNAMIC_STATE_CREATE_INFO;
  pipelineDynamicStateInfo.pNext = (void *)0x0;
  pipelineDynamicStateInfo.flags = 0;
  pVVar5 = (VkPipelineDepthStencilStateCreateInfo *)0x0;
  graphicsPipelineInfo.pDynamicState = (VkPipelineDynamicStateCreateInfo *)&pipelineDynamicStateInfo
  ;
  pipelineDynamicStateInfo.pDynamicStates =
       dynamicStates.super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>.
       _M_impl.super__Vector_impl_data._M_start;
  if ((long)dynamicStates.
            super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)dynamicStates.
            super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    graphicsPipelineInfo.pDynamicState = (VkPipelineDynamicStateCreateInfo *)pVVar5;
    pipelineDynamicStateInfo.pDynamicStates = &pVVar5->sType;
  }
  pipelineDynamicStateInfo.dynamicStateCount =
       (deUint32)
       ((ulong)((long)dynamicStates.
                      super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)dynamicStates.
                     super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>.
                     _M_impl.super__Vector_impl_data._M_start) >> 2);
  graphicsPipelineInfo.sType = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  graphicsPipelineInfo.pNext = (void *)0x0;
  graphicsPipelineInfo.flags = 0;
  graphicsPipelineInfo.pStages =
       (this->m_shaderStages).
       super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
       ._M_impl.super__Vector_impl_data._M_start;
  graphicsPipelineInfo.stageCount =
       (deUint32)
       (((long)(this->m_shaderStages).
               super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)graphicsPipelineInfo.pStages) /
       0x30);
  graphicsPipelineInfo.pVertexInputState = &vertexInputStateInfo;
  graphicsPipelineInfo.pInputAssemblyState = &pipelineInputAssemblyStateInfo;
  graphicsPipelineInfo.pTessellationState =
       (VkPipelineTessellationStateCreateInfo *)&pipelineTessellationStateInfo;
  if ((this->m_shaderStageFlags & 2) == 0) {
    graphicsPipelineInfo.pTessellationState = (VkPipelineTessellationStateCreateInfo *)pVVar5;
  }
  bVar8 = uVar7 == 0;
  graphicsPipelineInfo.pViewportState =
       (VkPipelineViewportStateCreateInfo *)&pipelineViewportStateInfo;
  if (bVar8) {
    graphicsPipelineInfo.pViewportState = (VkPipelineViewportStateCreateInfo *)pVVar5;
  }
  graphicsPipelineInfo.pRasterizationState = &local_208;
  graphicsPipelineInfo.pMultisampleState =
       (VkPipelineMultisampleStateCreateInfo *)&pipelineMultisampleStateInfo;
  if (bVar8) {
    graphicsPipelineInfo.pMultisampleState = (VkPipelineMultisampleStateCreateInfo *)pVVar5;
  }
  graphicsPipelineInfo.pDepthStencilState =
       (VkPipelineDepthStencilStateCreateInfo *)(local_1a0 + 0x10);
  if (bVar8) {
    graphicsPipelineInfo.pDepthStencilState = pVVar5;
  }
  graphicsPipelineInfo.pColorBlendState = (VkPipelineColorBlendStateCreateInfo *)local_1c8;
  if (bVar8) {
    graphicsPipelineInfo.pColorBlendState = (VkPipelineColorBlendStateCreateInfo *)pVVar5;
  }
  graphicsPipelineInfo.subpass = 0;
  graphicsPipelineInfo.basePipelineHandle.m_internal = 0;
  graphicsPipelineInfo.basePipelineIndex = 0;
  graphicsPipelineInfo.layout.m_internal = pipelineLayout.m_internal;
  graphicsPipelineInfo.renderPass.m_internal = renderPass.m_internal;
  ::vk::createGraphicsPipeline
            (__return_storage_ptr__,vk,device,(VkPipelineCache)0x0,&graphicsPipelineInfo,
             (VkAllocationCallbacks *)0x0);
  std::_Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::~_Vector_base
            (&dynamicStates.
              super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>);
  return __return_storage_ptr__;
}

Assistant:

Move<VkPipeline> GraphicsPipelineBuilder::build (const DeviceInterface&	vk,
												 const VkDevice			device,
												 const VkPipelineLayout	pipelineLayout,
												 const VkRenderPass		renderPass)
{
	const VkPipelineVertexInputStateCreateInfo vertexInputStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO,		// VkStructureType                             sType;
		DE_NULL,														// const void*                                 pNext;
		(VkPipelineVertexInputStateCreateFlags)0,						// VkPipelineVertexInputStateCreateFlags       flags;
		static_cast<deUint32>(m_vertexInputBindings.size()),			// uint32_t                                    vertexBindingDescriptionCount;
		dataPointer(m_vertexInputBindings),								// const VkVertexInputBindingDescription*      pVertexBindingDescriptions;
		static_cast<deUint32>(m_vertexInputAttributes.size()),			// uint32_t                                    vertexAttributeDescriptionCount;
		dataPointer(m_vertexInputAttributes),							// const VkVertexInputAttributeDescription*    pVertexAttributeDescriptions;
	};

	const VkPrimitiveTopology topology = (m_shaderStageFlags & VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT) ? VK_PRIMITIVE_TOPOLOGY_PATCH_LIST
																										 : m_primitiveTopology;
	const VkPipelineInputAssemblyStateCreateInfo pipelineInputAssemblyStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO,	// VkStructureType                             sType;
		DE_NULL,														// const void*                                 pNext;
		(VkPipelineInputAssemblyStateCreateFlags)0,						// VkPipelineInputAssemblyStateCreateFlags     flags;
		topology,														// VkPrimitiveTopology                         topology;
		VK_FALSE,														// VkBool32                                    primitiveRestartEnable;
	};

	const VkPipelineTessellationStateCreateInfo pipelineTessellationStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO,		// VkStructureType                             sType;
		DE_NULL,														// const void*                                 pNext;
		(VkPipelineTessellationStateCreateFlags)0,						// VkPipelineTessellationStateCreateFlags      flags;
		m_patchControlPoints,											// uint32_t                                    patchControlPoints;
	};

	const VkViewport viewport = makeViewport(
		0.0f, 0.0f,
		static_cast<float>(m_renderSize.x()), static_cast<float>(m_renderSize.y()),
		0.0f, 1.0f);

	const VkRect2D scissor = {
		makeOffset2D(0, 0),
		makeExtent2D(m_renderSize.x(), m_renderSize.y()),
	};

	const bool haveRenderSize = m_renderSize.x() > 0 && m_renderSize.y() > 0;

	const VkPipelineViewportStateCreateInfo pipelineViewportStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO,	// VkStructureType                             sType;
		DE_NULL,												// const void*                                 pNext;
		(VkPipelineViewportStateCreateFlags)0,					// VkPipelineViewportStateCreateFlags          flags;
		1u,														// uint32_t                                    viewportCount;
		haveRenderSize ? &viewport : DE_NULL,					// const VkViewport*                           pViewports;
		1u,														// uint32_t                                    scissorCount;
		haveRenderSize ? &scissor : DE_NULL,					// const VkRect2D*                             pScissors;
	};

	const bool isRasterizationDisabled = ((m_shaderStageFlags & VK_SHADER_STAGE_FRAGMENT_BIT) == 0);
	const VkPipelineRasterizationStateCreateInfo pipelineRasterizationStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO,		// VkStructureType                          sType;
		DE_NULL,														// const void*                              pNext;
		(VkPipelineRasterizationStateCreateFlags)0,						// VkPipelineRasterizationStateCreateFlags  flags;
		VK_FALSE,														// VkBool32                                 depthClampEnable;
		isRasterizationDisabled,										// VkBool32                                 rasterizerDiscardEnable;
		VK_POLYGON_MODE_FILL,											// VkPolygonMode							polygonMode;
		m_cullModeFlags,												// VkCullModeFlags							cullMode;
		m_frontFace,													// VkFrontFace								frontFace;
		VK_FALSE,														// VkBool32									depthBiasEnable;
		0.0f,															// float									depthBiasConstantFactor;
		0.0f,															// float									depthBiasClamp;
		0.0f,															// float									depthBiasSlopeFactor;
		1.0f,															// float									lineWidth;
	};

	const VkPipelineMultisampleStateCreateInfo pipelineMultisampleStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO,	// VkStructureType							sType;
		DE_NULL,													// const void*								pNext;
		(VkPipelineMultisampleStateCreateFlags)0,					// VkPipelineMultisampleStateCreateFlags	flags;
		VK_SAMPLE_COUNT_1_BIT,										// VkSampleCountFlagBits					rasterizationSamples;
		VK_FALSE,													// VkBool32									sampleShadingEnable;
		0.0f,														// float									minSampleShading;
		DE_NULL,													// const VkSampleMask*						pSampleMask;
		VK_FALSE,													// VkBool32									alphaToCoverageEnable;
		VK_FALSE													// VkBool32									alphaToOneEnable;
	};

	const VkStencilOpState stencilOpState = makeStencilOpState(
		VK_STENCIL_OP_KEEP,		// stencil fail
		VK_STENCIL_OP_KEEP,		// depth & stencil pass
		VK_STENCIL_OP_KEEP,		// depth only fail
		VK_COMPARE_OP_NEVER,	// compare op
		0u,						// compare mask
		0u,						// write mask
		0u);					// reference

	const VkPipelineDepthStencilStateCreateInfo pipelineDepthStencilStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO,	// VkStructureType							sType;
		DE_NULL,													// const void*								pNext;
		(VkPipelineDepthStencilStateCreateFlags)0,					// VkPipelineDepthStencilStateCreateFlags	flags;
		VK_FALSE,													// VkBool32									depthTestEnable;
		VK_FALSE,													// VkBool32									depthWriteEnable;
		VK_COMPARE_OP_LESS,											// VkCompareOp								depthCompareOp;
		VK_FALSE,													// VkBool32									depthBoundsTestEnable;
		VK_FALSE,													// VkBool32									stencilTestEnable;
		stencilOpState,												// VkStencilOpState							front;
		stencilOpState,												// VkStencilOpState							back;
		0.0f,														// float									minDepthBounds;
		1.0f,														// float									maxDepthBounds;
	};

	const VkColorComponentFlags colorComponentsAll = VK_COLOR_COMPONENT_R_BIT | VK_COLOR_COMPONENT_G_BIT | VK_COLOR_COMPONENT_B_BIT | VK_COLOR_COMPONENT_A_BIT;
	const VkPipelineColorBlendAttachmentState pipelineColorBlendAttachmentState =
	{
		m_blendEnable,						// VkBool32					blendEnable;
		VK_BLEND_FACTOR_SRC_ALPHA,			// VkBlendFactor			srcColorBlendFactor;
		VK_BLEND_FACTOR_ONE,				// VkBlendFactor			dstColorBlendFactor;
		VK_BLEND_OP_ADD,					// VkBlendOp				colorBlendOp;
		VK_BLEND_FACTOR_SRC_ALPHA,			// VkBlendFactor			srcAlphaBlendFactor;
		VK_BLEND_FACTOR_ONE,				// VkBlendFactor			dstAlphaBlendFactor;
		VK_BLEND_OP_ADD,					// VkBlendOp				alphaBlendOp;
		colorComponentsAll,					// VkColorComponentFlags	colorWriteMask;
	};

	const VkPipelineColorBlendStateCreateInfo pipelineColorBlendStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO,	// VkStructureType								sType;
		DE_NULL,													// const void*									pNext;
		(VkPipelineColorBlendStateCreateFlags)0,					// VkPipelineColorBlendStateCreateFlags			flags;
		VK_FALSE,													// VkBool32										logicOpEnable;
		VK_LOGIC_OP_COPY,											// VkLogicOp									logicOp;
		1u,															// deUint32										attachmentCount;
		&pipelineColorBlendAttachmentState,							// const VkPipelineColorBlendAttachmentState*	pAttachments;
		{ 0.0f, 0.0f, 0.0f, 0.0f },									// float										blendConstants[4];
	};

	std::vector<VkDynamicState> dynamicStates;
	if (!haveRenderSize)
	{
		dynamicStates.push_back(VK_DYNAMIC_STATE_VIEWPORT);
		dynamicStates.push_back(VK_DYNAMIC_STATE_SCISSOR);
	}

	const VkPipelineDynamicStateCreateInfo pipelineDynamicStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_DYNAMIC_STATE_CREATE_INFO,	// VkStructureType						sType;
		DE_NULL,												// const void*							pNext;
		0,														// VkPipelineDynamicStateCreateFlags	flags;
		static_cast<deUint32>(dynamicStates.size()),			// uint32_t								dynamicStateCount;
		(dynamicStates.empty() ? DE_NULL : &dynamicStates[0]),	// const VkDynamicState*				pDynamicStates;
	};

	const VkGraphicsPipelineCreateInfo graphicsPipelineInfo =
	{
		VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO,						// VkStructureType									sType;
		DE_NULL,																// const void*										pNext;
		(VkPipelineCreateFlags)0,												// VkPipelineCreateFlags							flags;
		static_cast<deUint32>(m_shaderStages.size()),							// deUint32											stageCount;
		&m_shaderStages[0],														// const VkPipelineShaderStageCreateInfo*			pStages;
		&vertexInputStateInfo,													// const VkPipelineVertexInputStateCreateInfo*		pVertexInputState;
		&pipelineInputAssemblyStateInfo,										// const VkPipelineInputAssemblyStateCreateInfo*	pInputAssemblyState;
		(m_shaderStageFlags & VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT ? &pipelineTessellationStateInfo : DE_NULL), // const VkPipelineTessellationStateCreateInfo*		pTessellationState;
		(isRasterizationDisabled ? DE_NULL : &pipelineViewportStateInfo),		// const VkPipelineViewportStateCreateInfo*			pViewportState;
		&pipelineRasterizationStateInfo,										// const VkPipelineRasterizationStateCreateInfo*	pRasterizationState;
		(isRasterizationDisabled ? DE_NULL : &pipelineMultisampleStateInfo),	// const VkPipelineMultisampleStateCreateInfo*		pMultisampleState;
		(isRasterizationDisabled ? DE_NULL : &pipelineDepthStencilStateInfo),	// const VkPipelineDepthStencilStateCreateInfo*		pDepthStencilState;
		(isRasterizationDisabled ? DE_NULL : &pipelineColorBlendStateInfo),		// const VkPipelineColorBlendStateCreateInfo*		pColorBlendState;
		(dynamicStates.empty() ? DE_NULL : &pipelineDynamicStateInfo),			// const VkPipelineDynamicStateCreateInfo*			pDynamicState;
		pipelineLayout,															// VkPipelineLayout									layout;
		renderPass,																// VkRenderPass										renderPass;
		0u,																		// deUint32											subpass;
		DE_NULL,																// VkPipeline										basePipelineHandle;
		0,																		// deInt32											basePipelineIndex;
	};

	return createGraphicsPipeline(vk, device, DE_NULL, &graphicsPipelineInfo);
}